

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_tests.cc
# Opt level: O0

void lf::fe::test::
     CheckElementMatrixProvider<double,double,lf::fe::MassEdgeMatrixProvider<double,lf::fe::test::lf_fe_MassEdgeMatrixProvider_Test::TestBody()::__0,lf::base::PredicateTrue>,lf::fe::test::lf_fe_MassEdgeMatrixProvider_Test::TestBody()::__1&>
               (ScalarFESpace<double> *fes_test,ScalarFESpace<double> *fes_trial,
               MassEdgeMatrixProvider<double,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_test_loc_comp_tests_cc:381:12),_lf::base::PredicateTrue>
               *emp,anon_class_24_3_4c06d6f7 *evaluator,dim_t codim)

{
  dim_t codim_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Index IVar4;
  Index IVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Scalar *pSVar6;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var7;
  char *message;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *this;
  AssertHelper local_f0;
  Message local_e8;
  double local_e0;
  double local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  Scalar entry;
  scalar_matrix_t result;
  size_type j;
  size_type i;
  Matrix<double,__1,__1,_0,__1,__1> system_matrix;
  COOMatrix<double> coo_matrix;
  uint local_5c;
  undefined1 local_58 [8];
  Matrix<double,__1,_1,_0,__1,_1> coeff_trial;
  undefined1 local_40 [8];
  Matrix<double,__1,_1,_0,__1,_1> coeff_test;
  dim_t codim_local;
  anon_class_24_3_4c06d6f7 *evaluator_local;
  MassEdgeMatrixProvider<double,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_test_loc_comp_tests_cc:381:12),_lf::base::PredicateTrue>
  *emp_local;
  ScalarFESpace<double> *fes_trial_local;
  ScalarFESpace<double> *fes_test_local;
  
  coeff_test.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
       codim;
  iVar2 = (*fes_test->_vptr_ScalarFESpace[1])();
  coeff_trial.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_
       = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_40,
             (uint *)((long)&coeff_trial.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows + 4));
  iVar2 = (*fes_trial->_vptr_ScalarFESpace[1])();
  local_5c = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x10))();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_58,&local_5c);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_58);
  IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40);
  IVar5 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_58);
  assemble::COOMatrix<double>::COOMatrix
            ((COOMatrix<double> *)
             &system_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols,(size_type)IVar4,(size_type)IVar5);
  codim_00 = coeff_test.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows._4_4_;
  iVar2 = (*fes_trial->_vptr_ScalarFESpace[1])();
  iVar3 = (*fes_test->_vptr_ScalarFESpace[1])();
  assemble::
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_const_lf::fe::MassEdgeMatrixProvider<double,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_test_loc_comp_tests_cc:381:12),_lf::base::PredicateTrue>_>
            (codim_00,(DofHandler *)CONCAT44(extraout_var_01,iVar2),
             (DofHandler *)CONCAT44(extraout_var_02,iVar3),emp,
             (COOMatrix<double> *)
             &system_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols);
  assemble::COOMatrix<double>::makeDense
            ((Matrix<double,__1,__1,_0,__1,__1> *)&j,
             (COOMatrix<double> *)
             &system_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols);
  for (result._4_4_ = 0;
      IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_40),
      (long)(ulong)result._4_4_ < IVar4; result._4_4_ = result._4_4_ + 1) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,
                        (ulong)result._4_4_);
    *pSVar6 = 1.0;
    for (result._0_4_ = 0;
        IVar4 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                          ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_58),
        (long)(ulong)result._0_4_ < IVar4; result._0_4_ = result._0_4_ + 1) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_58,
                          (ulong)result._0_4_);
      *pSVar6 = 1.0;
      lf_fe_MassEdgeMatrixProvider_Test::TestBody::anon_class_24_3_4c06d6f7::operator()
                (evaluator,(VectorXd *)local_40,(VectorXd *)local_58);
      p_Var7 = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&j,
                             (ulong)result._4_4_,(ulong)result._0_4_);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           *(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             *)&p_Var7->_M_t;
      this = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&j;
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                (this,(ulong)result._4_4_,(ulong)result._0_4_);
      std::abs((int)this);
      local_e0 = 1e-07;
      testing::internal::CmpHelperLT<double,double>
                ((internal *)local_d0,"std::abs(result - system_matrix(i, j))","1e-7",&local_d8,
                 &local_e0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_e8);
        message = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/test/loc_comp_tests.cc"
                   ,0xea,message);
        testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        testing::Message::~Message(&local_e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (!bVar1) goto LAB_00224b62;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_58,
                          (ulong)result._0_4_);
      *pSVar6 = 0.0;
    }
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,
                        (ulong)result._4_4_);
    *pSVar6 = 0.0;
  }
LAB_00224b62:
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)&j);
  assemble::COOMatrix<double>::~COOMatrix
            ((COOMatrix<double> *)
             &system_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_58);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_40);
  return;
}

Assistant:

void CheckElementMatrixProvider(const ScalarFESpace<SCALAR_TEST> &fes_test,
                                const ScalarFESpace<SCALAR_TRIAL> &fes_trial,
                                const EMP &emp, EVALUATOR &&evaluator,
                                base::dim_t codim = 0) {
  Eigen::Matrix<SCALAR_TEST, Eigen::Dynamic, 1> coeff_test(
      fes_test.LocGlobMap().NumDofs());
  Eigen::Matrix<SCALAR_TRIAL, Eigen::Dynamic, 1> coeff_trial(
      fes_trial.LocGlobMap().NumDofs());
  coeff_test.setZero();
  coeff_trial.setZero();

  using scalar_matrix_t = decltype(evaluator(coeff_test, coeff_trial));

  // assemble the matrix:
  assemble::COOMatrix<scalar_matrix_t> coo_matrix(coeff_test.rows(),
                                                  coeff_trial.rows());
  assemble::AssembleMatrixLocally(codim, fes_trial.LocGlobMap(),
                                  fes_test.LocGlobMap(), emp, coo_matrix);
  Eigen::Matrix<scalar_matrix_t, Eigen::Dynamic, Eigen::Dynamic> system_matrix =
      coo_matrix.makeDense();

  for (base::size_type i = 0; i < coeff_test.rows(); ++i) {
    coeff_test(i) = 1.;
    for (base::size_type j = 0; j < coeff_trial.rows(); ++j) {
      coeff_trial(j) = 1.;
      scalar_matrix_t result = evaluator(coeff_test, coeff_trial);
      auto entry = system_matrix(i, j);
      ASSERT_LT(std::abs(result - system_matrix(i, j)), 1e-7);
      coeff_trial(j) = 0.;
    }
    coeff_test(i) = 0;
  }
}